

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateCanModelBeUpdatable(Result *__return_storage_ptr__,Model *format)

{
  uint32 uVar1;
  string err;
  Result r;
  
  Result::Result(&r);
  uVar1 = format->_oneof_case_[0];
  if ((((uVar1 - 200 < 3) || (uVar1 - 0x193 < 2)) || (uVar1 == 500)) || (uVar1 == 0x12f)) {
    Result::Result(__return_storage_ptr__,&r);
  }
  else {
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&err);
    Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,&err);
    std::__cxx11::string::~string((string *)&err);
  }
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validateCanModelBeUpdatable(const Specification::Model& format) {
        Result r;
        switch (format.Type_case()) {
            case Specification::Model::kNeuralNetwork:
            case Specification::Model::kNeuralNetworkRegressor:
            case Specification::Model::kNeuralNetworkClassifier:
            case Specification::Model::kKNearestNeighborsClassifier:
            case Specification::Model::kPipeline:
            case Specification::Model::kPipelineRegressor:
            case Specification::Model::kPipelineClassifier:
                return r;
            default: {
                std::string err;
                err = "This model type is not supported for on-device update.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
            }
        }
    }